

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_encode_extl(char *data,int8_t type,uint32_t len)

{
  char *pcVar1;
  uint32_t len_local;
  int8_t type_local;
  char *data_local;
  
  if (((len == 0) || (0x10 < len)) || (mp_ext_hint[len - 1] == '\0')) {
    if (len < 0x100) {
      pcVar1 = mp_store_u8(data,199);
      _len_local = mp_store_u8(pcVar1,(uint8_t)len);
    }
    else if (len < 0x10000) {
      pcVar1 = mp_store_u8(data,200);
      _len_local = mp_store_u16(pcVar1,(uint16_t)len);
    }
    else {
      pcVar1 = mp_store_u8(data,0xc9);
      _len_local = mp_store_u32(pcVar1,len);
    }
  }
  else {
    _len_local = mp_store_u8(data,mp_ext_hint[len - 1]);
  }
  pcVar1 = mp_store_u8(_len_local,type);
  return pcVar1;
}

Assistant:

MP_IMPL char *
mp_encode_extl(char *data, int8_t type, uint32_t len)
{
	/*
	 * Only use fixext when length is exactly 1, 2, 4, 8 or 16.
	 * Otherwise use ext 8 if length <= 255.
	 */
	if (len && len <= 16 && mp_ext_hint[len-1]) {
		data = mp_store_u8(data, mp_ext_hint[len-1]);
	} else if (len <= UINT8_MAX) {
		data = mp_store_u8(data, 0xc7);
		data = mp_store_u8(data, (uint8_t) len);
	} else if (len <= UINT16_MAX) {
		data = mp_store_u8(data, 0xc8);
		data = mp_store_u16(data, (uint16_t) len);
	} else {
		data = mp_store_u8(data, 0xc9);
		data = mp_store_u32(data,len);
	}
	data = mp_store_u8(data, type);
	return data;
}